

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warnings.cpp
# Opt level: O0

vector<bilingual_str,_std::allocator<bilingual_str>_> * __thiscall
node::Warnings::GetMessages(Warnings *this)

{
  long lVar1;
  bool bVar2;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *in_RDI;
  long in_FS_OFFSET;
  type *msg;
  type *id;
  map<std::variant<kernel::Warning,_node::Warning>,_bilingual_str,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
  *__range1;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *messages;
  const_iterator __end1;
  const_iterator __begin1;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock2;
  pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str> *in_stack_ffffffffffffff68
  ;
  value_type *in_stack_ffffffffffffff70;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *pvVar3;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffa0;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar3 = in_RDI;
  MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffff68);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (int)((ulong)pvVar3 >> 0x20),SUB81((ulong)pvVar3 >> 0x18,0));
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::vector
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_ffffffffffffff68);
  std::
  map<std::variant<kernel::Warning,_node::Warning>,_bilingual_str,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
  ::size((map<std::variant<kernel::Warning,_node::Warning>,_bilingual_str,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
          *)in_stack_ffffffffffffff68);
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::reserve
            (in_stack_ffffffffffffffa8,(size_type)in_stack_ffffffffffffffa0);
  std::
  map<std::variant<kernel::Warning,_node::Warning>,_bilingual_str,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
  ::begin((map<std::variant<kernel::Warning,_node::Warning>,_bilingual_str,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
           *)in_stack_ffffffffffffff70);
  std::
  map<std::variant<kernel::Warning,_node::Warning>,_bilingual_str,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
  ::end((map<std::variant<kernel::Warning,_node::Warning>,_bilingual_str,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
         *)in_stack_ffffffffffffff70);
  while (bVar2 = std::operator==((_Self *)in_RDI,(_Self *)in_stack_ffffffffffffff70),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>
    ::operator*((_Rb_tree_const_iterator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>
                 *)in_stack_ffffffffffffff68);
    std::get<0ul,std::variant<kernel::Warning,node::Warning>const,bilingual_str>
              (in_stack_ffffffffffffff68);
    std::get<1ul,std::variant<kernel::Warning,node::Warning>const,bilingual_str>
              (in_stack_ffffffffffffff68);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
              (in_RDI,in_stack_ffffffffffffff70);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>
                  *)in_stack_ffffffffffffff68);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::vector<bilingual_str> Warnings::GetMessages() const
{
    LOCK(m_mutex);
    std::vector<bilingual_str> messages;
    messages.reserve(m_warnings.size());
    for (const auto& [id, msg] : m_warnings) {
        messages.push_back(msg);
    }
    return messages;
}